

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * __thiscall
ByteCodeGenerator::StartBindFunction
          (ByteCodeGenerator *this,char16 *name,uint nameLength,uint shortNameOffset,
          bool *pfuncExprWithName,ParseNodeFnc *pnodeFnc,ParseableFunctionInfo *reuseNestedFunc)

{
  uint uVar1;
  uint uScriptId;
  ScriptContext *pSVar2;
  code *pcVar3;
  JavascriptMethod p_Var4;
  bool bVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  BOOL BVar8;
  Attributes AVar9;
  LocalFunctionId LVar10;
  Attributes AVar11;
  PropertyId pos;
  ScopeInfo *pSVar12;
  Utf8SourceInfo *pUVar13;
  ParseableFunctionInfo *pPVar14;
  undefined4 *puVar15;
  SRCINFO *this_00;
  SourceContextInfo *pSVar16;
  ByteBlock *pBVar17;
  JavascriptLibrary *this_01;
  CharacterBuffer<char16_t> *propName;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar18;
  Scope *pSVar19;
  FuncInfo *pFVar20;
  FunctionBody *pFVar21;
  Scope *local_358;
  Scope *local_350;
  bool local_1d2;
  JavascriptMethod local_198;
  int32 currentAstSize;
  FunctionBody *parsedFunctionBody_2;
  TrackAllocData local_160;
  FuncInfo *local_138;
  FuncInfo *funcInfo;
  undefined8 local_128;
  TrackAllocData local_120;
  code *local_f8;
  undefined8 local_f0;
  TrackAllocData local_e8;
  Scope *local_c0;
  Scope *bodyScope;
  Scope *paramScope;
  Symbol *sym;
  Scope *funcExprScope;
  FunctionBody *parsedFunctionBody_1;
  bool local_8d;
  Attributes attributes;
  bool createFunctionBody;
  ParseableFunctionInfo *pPStack_88;
  LocalFunctionId functionId;
  ParseableFunctionInfo *parent;
  FunctionBody *parsedFunctionBody;
  undefined1 local_68 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  ParseableFunctionInfo *parseableFunctionInfo;
  bool funcExprWithName;
  ParseNodeFnc *pnodeFnc_local;
  bool *pfuncExprWithName_local;
  uint shortNameOffset_local;
  uint nameLength_local;
  char16 *name_local;
  ByteCodeGenerator *this_local;
  
  autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)0x0;
  if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
    local_198 = (JavascriptMethod)0x0;
  }
  else {
    local_198 = Js::FunctionProxy::GetOriginalEntryPoint_Unchecked
                          (&reuseNestedFunc->super_FunctionProxy);
  }
  Js::AutoRestoreFunctionInfo::AutoRestoreFunctionInfo
            ((AutoRestoreFunctionInfo *)local_68,reuseNestedFunc,local_198);
  if ((this->pCurrentFunction == (FunctionBody *)0x0) ||
     (bVar5 = Js::ParseableFunctionInfo::IsFunctionParsed
                        (&this->pCurrentFunction->super_ParseableFunctionInfo), !bVar5)) {
    parseableFunctionInfo._7_1_ = (bool)(*pfuncExprWithName & 1);
    attributes = pnodeFnc->functionId;
    local_8d = (DAT_01e9e300 & 1) == 0 || pnodeFnc->pnodeBody != (ParseNodePtr)0x0;
    AVar9 = GetFunctionInfoAttributes(pnodeFnc);
    AVar11 = attributes;
    parsedFunctionBody_1._4_4_ = AVar9;
    if ((local_8d & 1U) == 0) {
      if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
        pSVar2 = this->scriptContext;
        pUVar13 = this->m_utf8SourceInfo;
        uVar1 = pnodeFnc->nestedCount;
        bVar5 = ParseNodeFnc::IsClassConstructor(pnodeFnc);
        autoRestoreFunctionInfo.originalEntryPoint =
             (JavascriptMethod)
             Js::ParseableFunctionInfo::New
                       (pSVar2,uVar1,AVar11,pUVar13,name,nameLength,shortNameOffset,AVar9,
                        (~bVar5 & 1U) << 6);
      }
      else {
        bVar5 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (bVar5) {
          pFVar21 = Js::FunctionProxy::GetFunctionBody(&reuseNestedFunc->super_FunctionProxy);
          pBVar17 = Js::FunctionBody::GetByteCode(pFVar21);
          if (pBVar17 == (ByteBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar15 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0x590,
                               "(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr)"
                               ,
                               "!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr"
                              );
            if (!bVar5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar15 = 0;
          }
        }
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x591,"(pnodeFnc->pnodeBody == nullptr)",
                             "pnodeFnc->pnodeBody == nullptr");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 0;
        }
        autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)reuseNestedFunc;
        AVar11 = Js::FunctionProxy::GetAttributes(&reuseNestedFunc->super_FunctionProxy);
        if ((AVar11 & (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|
                       Module|Async|Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|
                      ErrorOnNew)) !=
            (parsedFunctionBody_1._4_4_ &
            (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async
             |Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x593,
                             "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                             ,
                             "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                            );
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar15 = 0;
        }
      }
    }
    else if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
      pSVar2 = this->scriptContext;
      pUVar13 = this->m_utf8SourceInfo;
      uVar1 = pnodeFnc->nestedCount;
      this_00 = Js::Utf8SourceInfo::GetSrcInfo(pUVar13);
      pSVar16 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_00->sourceContextInfo);
      AVar9 = attributes;
      AVar11 = parsedFunctionBody_1._4_4_;
      uScriptId = pSVar16->sourceContextId;
      bVar5 = ParseNodeFnc::IsClassConstructor(pnodeFnc);
      autoRestoreFunctionInfo.originalEntryPoint =
           (JavascriptMethod)
           Js::FunctionBody::NewFromRecycler
                     (pSVar2,name,nameLength,shortNameOffset,uVar1,pUVar13,uScriptId,AVar9,AVar11,
                      (~bVar5 & 1U) << 6);
    }
    else {
      bVar5 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
      if (bVar5) {
        autoRestoreFunctionInfo.originalEntryPoint =
             (JavascriptMethod)
             Js::FunctionProxy::GetFunctionBody(&reuseNestedFunc->super_FunctionProxy);
      }
      else {
        pUVar13 = Js::FunctionProxy::GetUtf8SourceInfo(&reuseNestedFunc->super_FunctionProxy);
        LVar10 = Js::FunctionProxy::GetLocalFunctionId(&reuseNestedFunc->super_FunctionProxy);
        Js::Utf8SourceInfo::StopTrackingDeferredFunction(pUVar13,LVar10);
        pPVar14 = Js::FunctionProxy::GetParseableFunctionInfo(&reuseNestedFunc->super_FunctionProxy)
        ;
        funcExprScope = (Scope *)Js::FunctionBody::NewFromParseableFunctionInfo(pPVar14);
        autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)funcExprScope;
        autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)funcExprScope;
      }
      AVar11 = Js::FunctionProxy::GetAttributes
                         ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if ((AVar11 & (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|
                     Module|Async|Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|
                    ErrorOnNew)) !=
          (parsedFunctionBody_1._4_4_ &
          (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async|
           Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x57c,
                           "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                           ,
                           "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 0;
      }
    }
    this_01 = Js::ScriptContext::GetLibrary(this->scriptContext);
    Js::JavascriptLibrary::RegisterDynamicFunctionReference
              (this_01,(FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
    p_Var4 = autoRestoreFunctionInfo.originalEntryPoint;
    *(LocalFunctionId *)(autoRestoreFunctionInfo.originalEntryPoint + 0xb0) =
         pnodeFnc->deferredParseNextFunctionId;
    bVar5 = ParseNodeFnc::IsDeclaration(pnodeFnc);
    Js::ParseableFunctionInfo::SetIsDeclaration((ParseableFunctionInfo *)p_Var4,bVar5);
    p_Var4 = autoRestoreFunctionInfo.originalEntryPoint;
    bVar5 = ParseNodeFnc::IsMethod(pnodeFnc);
    Js::ParseableFunctionInfo::SetIsMethod((ParseableFunctionInfo *)p_Var4,bVar5);
    p_Var4 = autoRestoreFunctionInfo.originalEntryPoint;
    bVar5 = ParseNodeFnc::IsAccessor(pnodeFnc);
    Js::ParseableFunctionInfo::SetIsAccessor((ParseableFunctionInfo *)p_Var4,bVar5);
    bVar5 = ParseNodeFnc::IsAccessor(pnodeFnc);
    if (bVar5) {
      Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
                (&this->scriptContext->optimizationOverrides,SideEffects_Accessor);
    }
  }
  else {
    cVar6 = Js::ParseableFunctionInfo::StartInDocument
                      (&this->pCurrentFunction->super_ParseableFunctionInfo);
    if (cVar6 != (pnodeFnc->super_ParseNode).ichMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x534,"(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin)",
                         "this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    cVar6 = Js::ParseableFunctionInfo::LengthInChars
                      (&this->pCurrentFunction->super_ParseableFunctionInfo);
    cVar7 = ParseNode::LengthInCodepoints(&pnodeFnc->super_ParseNode);
    if (cVar6 != cVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x535,
                         "(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints())"
                         ,
                         "this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints()"
                        );
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    parent = &this->pCurrentFunction->super_ParseableFunctionInfo;
    Js::FunctionBody::RemoveDeferParseAttribute((FunctionBody *)parent);
    BVar8 = Js::FunctionProxy::IsDeferredParseFunction(&parent->super_FunctionProxy);
    if ((BVar8 != 0) && (bVar5 = Js::ParseableFunctionInfo::IsReparsed(parent), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x53c,
                         "(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed())"
                         ,
                         "!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed()"
                        );
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    bVar5 = Js::ParseableFunctionInfo::GetIsDeclaration(parent);
    ParseNodeFnc::SetDeclaration(pnodeFnc,bVar5);
    bVar5 = ParseNodeFnc::CanBeDeferred(pnodeFnc);
    pPVar14 = parent;
    if (!bVar5) {
      AVar11 = Js::FunctionProxy::GetAttributes(&parent->super_FunctionProxy);
      Js::FunctionProxy::SetAttributes(&pPVar14->super_FunctionProxy,AVar11 & ~CanDefer);
    }
    bVar5 = Js::ParseableFunctionInfo::GetIsDeclaration(parent);
    local_1d2 = false;
    if (!bVar5) {
      bVar5 = ParseNodeFnc::IsMethod(pnodeFnc);
      local_1d2 = false;
      if ((!bVar5) && (local_1d2 = false, pnodeFnc->pnodeName != (ParseNodeVar *)0x0)) {
        local_1d2 = (pnodeFnc->pnodeName->super_ParseNode).nop == knopVarDecl;
      }
    }
    parseableFunctionInfo._7_1_ = local_1d2;
    *pfuncExprWithName = local_1d2;
    LVar10 = Js::FunctionProxy::GetLocalFunctionId(&parent->super_FunctionProxy);
    if ((LVar10 != pnodeFnc->functionId) && (bVar5 = IsInNonDebugMode(this), bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x54a,
                         "(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode())"
                         ,
                         "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()"
                        );
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    Js::FunctionBody::ResetByteCodeGenVisitState((FunctionBody *)parent);
    pSVar12 = Js::ParseableFunctionInfo::GetScopeInfo(parent);
    if (pSVar12 != (ScopeInfo *)0x0) {
      pSVar12 = Js::ParseableFunctionInfo::GetScopeInfo(parent);
      pPStack_88 = Js::ScopeInfo::GetParseableFunctionInfo(pSVar12);
      if ((pPStack_88 != (ParseableFunctionInfo *)0x0) &&
         (bVar5 = Js::ParseableFunctionInfo::GetHasOrParentHasArguments(pPStack_88), bVar5)) {
        Js::ParseableFunctionInfo::SetHasOrParentHasArguments(parent,true);
      }
    }
    autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)parent;
  }
  sym = (Symbol *)0x0;
  if (parseableFunctionInfo._7_1_ != false) {
    sym = (Symbol *)pnodeFnc->scope;
    if (sym == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5b1,"(funcExprScope)","funcExprScope");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    PushScope(this,(Scope *)sym);
    paramScope = (Scope *)AddSymbolToScope(this,(Scope *)sym,name,nameLength,
                                           &pnodeFnc->pnodeName->super_ParseNode,STFunction);
    Symbol::SetIsFuncExpr((Symbol *)paramScope,true);
    p_Var4 = autoRestoreFunctionInfo.originalEntryPoint;
    pSVar19 = paramScope;
    propName = Symbol::GetName((Symbol *)paramScope);
    pos = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                    ((ParseableFunctionInfo *)p_Var4,propName);
    Symbol::SetPosition((Symbol *)pSVar19,pos);
    ParseNodeFnc::SetFuncSymbol(pnodeFnc,(Symbol *)paramScope);
    bVar5 = Scope::GetIsObject((Scope *)sym);
    if (bVar5) {
      Scope::SetMustInstantiate((Scope *)sym,true);
    }
  }
  if (pnodeFnc->pnodeScopes == (ParseNodeBlock *)0x0) {
    local_350 = (Scope *)0x0;
  }
  else {
    local_350 = pnodeFnc->pnodeScopes->scope;
  }
  bodyScope = local_350;
  if (pnodeFnc->pnodeBodyScope == (ParseNodeBlock *)0x0) {
    local_358 = (Scope *)0x0;
  }
  else {
    local_358 = pnodeFnc->pnodeBodyScope->scope;
  }
  local_c0 = local_358;
  if ((local_350 == (Scope *)0x0) && (pnodeFnc->pnodeScopes != (ParseNodeBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5c3,"(paramScope != nullptr || !pnodeFnc->pnodeScopes)",
                       "paramScope != nullptr || !pnodeFnc->pnodeScopes");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  if (bodyScope == (Scope *)0x0) {
    pAVar18 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&Scope::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
               ,0x5c6);
    pAVar18 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar18,&local_e8);
    local_f8 = Memory::ArenaAllocator::Alloc;
    local_f0 = 0;
    pSVar19 = (Scope *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar18,0x3f67b0);
    Scope::Scope(pSVar19,this->alloc,ScopeType_Parameter,1);
    bodyScope = pSVar19;
    if (pnodeFnc->pnodeScopes != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeScopes->scope = pSVar19;
    }
  }
  if (local_c0 == (Scope *)0x0) {
    pAVar18 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_120,(type_info *)&Scope::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
               ,0x5ce);
    pAVar18 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar18,&local_120);
    funcInfo = (FuncInfo *)Memory::ArenaAllocator::Alloc;
    local_128 = 0;
    pSVar19 = (Scope *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar18,0x3f67b0);
    Scope::Scope(pSVar19,this->alloc,ScopeType_FunctionBody,1);
    local_c0 = pSVar19;
    if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeBodyScope->scope = pSVar19;
    }
  }
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5d5,"(pnodeFnc->nop == knopFncDecl)",
                       "Non-function declaration trying to create function body");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  Js::ParseableFunctionInfo::SetIsGlobalFunc
            ((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint,false);
  bVar5 = ParseNodeFnc::GetStrictMode(pnodeFnc);
  if (bVar5) {
    Js::ParseableFunctionInfo::SetIsStrictMode
              ((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
  }
  pAVar18 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_160,(type_info *)&FuncInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
             ,0x5dd);
  pAVar18 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(pAVar18,&local_160);
  pFVar20 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,(ArenaAllocator *)pAVar18,0x3f67b0);
  FuncInfo::FuncInfo(pFVar20,name,this->alloc,this,bodyScope,local_c0,pnodeFnc,
                     (ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
  *(uint *)&pFVar20->field_0xb4 =
       *(uint *)&pFVar20->field_0xb4 & 0xfffeffff |
       (uint)(reuseNestedFunc != (ParseableFunctionInfo *)0x0) << 0x10;
  local_138 = pFVar20;
  bVar5 = ParseNodeFnc::GetArgumentsObjectEscapes(pnodeFnc);
  if (bVar5) {
    FuncEscapes(this,local_c0);
    FuncInfo::SetHasMaybeEscapedNestedFunc(local_138,L"ArgumentsObjectEscapes");
  }
  bVar5 = Js::FunctionProxy::IsFunctionBody
                    ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
  if (bVar5) {
    pFVar21 = Js::FunctionProxy::GetFunctionBody
                        ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
    bVar5 = Js::ParseableFunctionInfo::IsReparsed(&pFVar21->super_ParseableFunctionInfo);
    if (bVar5) {
      Js::FunctionBody::RestoreState(pFVar21,pnodeFnc);
    }
    else {
      Js::FunctionBody::SaveState(pFVar21,pnodeFnc);
    }
  }
  pFVar20 = local_138;
  bVar5 = ParseNodeFnc::ChildCallsEval(pnodeFnc);
  FuncInfo::SetChildCallsEval(pFVar20,bVar5);
  bVar5 = ParseNodeFnc::CallsEval(pnodeFnc);
  if (bVar5) {
    FuncInfo::SetCallsEval(local_138,true);
    Scope::SetIsDynamic(local_c0,true);
    Scope::SetIsObject(local_c0);
    Scope::SetCapturesAll(local_c0,true);
    Scope::SetMustInstantiate(local_c0,true);
    Scope::SetIsObject(bodyScope);
    Scope::SetCapturesAll(bodyScope,true);
    Scope::SetMustInstantiate(bodyScope,true);
  }
  PushFuncInfo(this,L"StartBindFunction",local_138);
  if (sym != (Symbol *)0x0) {
    Scope::SetFunc((Scope *)sym,local_138);
    local_138->funcExprScope = (Scope *)sym;
  }
  if (this->maxAstSize < pnodeFnc->astSize) {
    this->maxAstSize = pnodeFnc->astSize;
  }
  Js::AutoRestoreFunctionInfo::Clear((AutoRestoreFunctionInfo *)local_68);
  bVar5 = ParseNodeFnc::IsBodyAndParamScopeMerged(pnodeFnc);
  if (!bVar5) {
    FuncInfo::ResetBodyAndParamScopeMerged(local_138);
  }
  pFVar20 = local_138;
  Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)local_68);
  return pFVar20;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindFunction(const char16 *name, uint nameLength, uint shortNameOffset, bool* pfuncExprWithName, ParseNodeFnc *pnodeFnc, Js::ParseableFunctionInfo * reuseNestedFunc)
{
    bool funcExprWithName;
    Js::ParseableFunctionInfo* parseableFunctionInfo = nullptr;

    Js::AutoRestoreFunctionInfo autoRestoreFunctionInfo(reuseNestedFunc, reuseNestedFunc ? reuseNestedFunc->GetOriginalEntryPoint_Unchecked() : nullptr);

    if (this->pCurrentFunction &&
        this->pCurrentFunction->IsFunctionParsed())
    {
        Assert(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin);
        Assert(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints());

        // This is the root function for the current AST subtree, and it already has a FunctionBody
        // (created by a deferred parse) which we're now filling in.
        Js::FunctionBody * parsedFunctionBody = this->pCurrentFunction;
        parsedFunctionBody->RemoveDeferParseAttribute();

        Assert(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed());

        pnodeFnc->SetDeclaration(parsedFunctionBody->GetIsDeclaration());
        if (!pnodeFnc->CanBeDeferred())
        {
            parsedFunctionBody->SetAttributes(
                (Js::FunctionInfo::Attributes)(parsedFunctionBody->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
        }
        funcExprWithName =
            !(parsedFunctionBody->GetIsDeclaration() || pnodeFnc->IsMethod()) &&
            pnodeFnc->pnodeName != nullptr &&
            pnodeFnc->pnodeName->nop == knopVarDecl;
        *pfuncExprWithName = funcExprWithName;

        Assert(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode());

        // Some state may be tracked on the function body during the visit pass. Since the previous visit pass may have failed,
        // we need to reset the state on the function body.
        parsedFunctionBody->ResetByteCodeGenVisitState();

        if (parsedFunctionBody->GetScopeInfo())
        {
            // Propagate flags from the (real) parent function.
            Js::ParseableFunctionInfo *parent = parsedFunctionBody->GetScopeInfo()->GetParseableFunctionInfo();
            if (parent)
            {
                if (parent->GetHasOrParentHasArguments())
                {
                    parsedFunctionBody->SetHasOrParentHasArguments(true);
                }
            }
        }

        parseableFunctionInfo = parsedFunctionBody;
    }
    else
    {
        funcExprWithName = *pfuncExprWithName;
        Js::LocalFunctionId functionId = pnodeFnc->functionId;

        // Create a function body if:
        //  1. The parse node is not defer parsed
        //  2. Or creating function proxies is disallowed
        bool createFunctionBody = (pnodeFnc->pnodeBody != nullptr);
        if (!CONFIG_FLAG(CreateFunctionProxy)) createFunctionBody = true;

        const Js::FunctionInfo::Attributes attributes = GetFunctionInfoAttributes(pnodeFnc);

        if (createFunctionBody)
        {
            if (reuseNestedFunc)
            {
                if (!reuseNestedFunc->IsFunctionBody())
                {
                    reuseNestedFunc->GetUtf8SourceInfo()->StopTrackingDeferredFunction(reuseNestedFunc->GetLocalFunctionId());
                    Js::FunctionBody * parsedFunctionBody =
                        Js::FunctionBody::NewFromParseableFunctionInfo(reuseNestedFunc->GetParseableFunctionInfo());
                    autoRestoreFunctionInfo.funcBody = parsedFunctionBody;
                    parseableFunctionInfo = parsedFunctionBody;
                }
                else
                {
                    parseableFunctionInfo = reuseNestedFunc->GetFunctionBody();
                }
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::FunctionBody::NewFromRecycler(scriptContext, name, nameLength, shortNameOffset, pnodeFnc->nestedCount, m_utf8SourceInfo,
                    m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId, functionId
                    , attributes
                    , pnodeFnc->IsClassConstructor() ?
                        Js::FunctionBody::FunctionBodyFlags::Flags_None :
                        Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
                    , false /* is function from deferred deserialized proxy */
#endif
                );
            }
        }
        else
        {
            if (reuseNestedFunc)
            {
                Assert(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr);
                Assert(pnodeFnc->pnodeBody == nullptr);
                parseableFunctionInfo = reuseNestedFunc;
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::ParseableFunctionInfo::New(scriptContext, pnodeFnc->nestedCount, functionId, m_utf8SourceInfo, name, nameLength, shortNameOffset, attributes,
                                        pnodeFnc->IsClassConstructor() ?
                                            Js::FunctionBody::FunctionBodyFlags::Flags_None :
                                            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue);
            }
        }

        // In either case register the function reference
        scriptContext->GetLibrary()->RegisterDynamicFunctionReference(parseableFunctionInfo);

#if DBG
        parseableFunctionInfo->deferredParseNextFunctionId = pnodeFnc->deferredParseNextFunctionId;
#endif
        parseableFunctionInfo->SetIsDeclaration(pnodeFnc->IsDeclaration() != 0);
        parseableFunctionInfo->SetIsMethod(pnodeFnc->IsMethod() != 0);
        parseableFunctionInfo->SetIsAccessor(pnodeFnc->IsAccessor() != 0);
        if (pnodeFnc->IsAccessor())
        {
            scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
        }
    }

    Scope *funcExprScope = nullptr;
    if (funcExprWithName)
    {
        funcExprScope = pnodeFnc->scope;
        Assert(funcExprScope);
        PushScope(funcExprScope);
        Symbol *sym = AddSymbolToScope(funcExprScope, name, nameLength, pnodeFnc->pnodeName, STFunction);

        sym->SetIsFuncExpr(true);

        sym->SetPosition(parseableFunctionInfo->GetOrAddPropertyIdTracked(sym->GetName()));

        pnodeFnc->SetFuncSymbol(sym);

        if (funcExprScope->GetIsObject())
        {
            funcExprScope->SetMustInstantiate(true);
        }
    }

    Scope *paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
    Scope *bodyScope = pnodeFnc->pnodeBodyScope ? pnodeFnc->pnodeBodyScope->scope : nullptr;
    Assert(paramScope != nullptr || !pnodeFnc->pnodeScopes);
    if (paramScope == nullptr)
    {
        paramScope = Anew(alloc, Scope, alloc, ScopeType_Parameter, true);
        if (pnodeFnc->pnodeScopes)
        {
            pnodeFnc->pnodeScopes->scope = paramScope;
        }
    }
    if (bodyScope == nullptr)
    {
        bodyScope = Anew(alloc, Scope, alloc, ScopeType_FunctionBody, true);
        if (pnodeFnc->pnodeBodyScope)
        {
            pnodeFnc->pnodeBodyScope->scope = bodyScope;
        }
    }

    AssertMsg(pnodeFnc->nop == knopFncDecl, "Non-function declaration trying to create function body");

    parseableFunctionInfo->SetIsGlobalFunc(false);
    if (pnodeFnc->GetStrictMode() != 0)
    {
        parseableFunctionInfo->SetIsStrictMode();
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, name, alloc, this, paramScope, bodyScope, pnodeFnc, parseableFunctionInfo);

#if DBG
    funcInfo->isReused = (reuseNestedFunc != nullptr);
#endif

    if (pnodeFnc->GetArgumentsObjectEscapes())
    {
        // If the parser detected that the arguments object escapes, then the function scope escapes
        // and cannot be cached.
        this->FuncEscapes(bodyScope);
        funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("ArgumentsObjectEscapes")));
    }

    if (parseableFunctionInfo->IsFunctionBody())
    {
        Js::FunctionBody * parsedFunctionBody = parseableFunctionInfo->GetFunctionBody();
        if (parsedFunctionBody->IsReparsed())
        {
            parsedFunctionBody->RestoreState(pnodeFnc);
        }
        else
        {
            parsedFunctionBody->SaveState(pnodeFnc);
        }
    }

    funcInfo->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());

    if (pnodeFnc->CallsEval())
    {
        funcInfo->SetCallsEval(true);

        bodyScope->SetIsDynamic(true);
        bodyScope->SetIsObject();
        bodyScope->SetCapturesAll(true);
        bodyScope->SetMustInstantiate(true);

        // Do not mark param scope as dynamic as it does not leak declarations
        paramScope->SetIsObject();
        paramScope->SetCapturesAll(true);
        paramScope->SetMustInstantiate(true);
    }

    PushFuncInfo(_u("StartBindFunction"), funcInfo);

    if (funcExprScope)
    {
        funcExprScope->SetFunc(funcInfo);
        funcInfo->funcExprScope = funcExprScope;
    }

    int32 currentAstSize = pnodeFnc->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }

    autoRestoreFunctionInfo.Clear();

    if (!pnodeFnc->IsBodyAndParamScopeMerged())
    {
        funcInfo->ResetBodyAndParamScopeMerged();
    }

    return funcInfo;
}